

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makePointerDebugType(Builder *this,StorageClass storageClass,Id baseType)

{
  pointer ppIVar1;
  Builder *this_00;
  Id id;
  Id IVar2;
  Id IVar3;
  mapped_type_conflict *pmVar4;
  mapped_type *pmVar5;
  Instruction *pIVar6;
  Id IVar7;
  pointer ppIVar8;
  Instruction *type;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_50;
  Builder *local_48;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Id baseType_local;
  
  baseType_local = baseType;
  pmVar4 = std::
           map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[](&this->debugId,&baseType_local);
  IVar3 = *pmVar4;
  if (IVar3 == 0) {
    IVar3 = makeDebugInfoNone(this);
  }
  else {
    id = makeUintConstant(this,storageClass,false);
    local_50 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->groupedDebugTypes;
    type = (Instruction *)CONCAT44(type._4_4_,3);
    local_48 = this;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_50,(key_type *)&type);
    ppIVar1 = (pmVar5->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar8 = (pmVar5->
                   super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
                   _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar1;
        ppIVar8 = ppIVar8 + 1) {
      pIVar6 = *ppIVar8;
      IVar2 = Instruction::getIdOperand(pIVar6,2);
      if ((IVar2 == IVar3) && (IVar2 = Instruction::getIdOperand(pIVar6,3), IVar2 == id)) {
        return pIVar6->resultId;
      }
    }
    pIVar6 = (Instruction *)::operator_new(0x60);
    this_00 = local_48;
    IVar7 = local_48->uniqueId + 1;
    local_48->uniqueId = IVar7;
    IVar2 = makeVoidType(local_48);
    pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
    pIVar6->resultId = IVar7;
    pIVar6->typeId = IVar2;
    pIVar6->opCode = OpExtInst;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    pIVar6->block = (Block *)0x0;
    type = pIVar6;
    Instruction::reserveOperands(pIVar6,5);
    Instruction::addIdOperand(pIVar6,this_00->nonSemanticShaderDebugInfo);
    Instruction::addImmediateOperand(pIVar6,3);
    Instruction::addIdOperand(pIVar6,IVar3);
    Instruction::addIdOperand(pIVar6,id);
    IVar3 = makeUintConstant(this_00,0,false);
    Instruction::addIdOperand(pIVar6,IVar3);
    local_40._M_head_impl._0_4_ = 3;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](local_50,(key_type *)&local_40);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar5,&type);
    local_40._M_head_impl = type;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this_00->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
    if (local_40._M_head_impl != (Instruction *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this_00->module,type);
    IVar3 = type->resultId;
  }
  return IVar3;
}

Assistant:

Id Builder::makePointerDebugType(StorageClass storageClass, Id const baseType)
{
    const Id debugBaseType = debugId[baseType];
    if (!debugBaseType) {
        return makeDebugInfoNone();
    }
    const Id scID = makeUintConstant(storageClass);
    for (Instruction* otherType : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer]) {
        if (otherType->getIdOperand(2) == debugBaseType &&
            otherType->getIdOperand(3) == scID) {
            return otherType->getResultId();
        }
    }

    Instruction* type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(5);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(debugBaseType);
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}